

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O0

KLVFilePacket * __thiscall
ASDCP::KLVFilePacket::InitFromFile(KLVFilePacket *this,IFileReader *Reader,UL *label)

{
  bool bVar1;
  int iVar2;
  UL *in_RCX;
  Result_t *local_90;
  UL local_60;
  undefined1 local_29;
  UL *local_28;
  UL *label_local;
  IFileReader *Reader_local;
  KLVFilePacket *this_local;
  Result_t *result;
  
  local_29 = 0;
  local_28 = in_RCX;
  label_local = label;
  Reader_local = Reader;
  this_local = this;
  InitFromFile(this,Reader);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    UL::UL(&local_60,*(byte_t **)(Reader + 8));
    bVar1 = UL::operator==(&local_60,local_28);
    if (bVar1) {
      local_90 = (Result_t *)Kumu::RESULT_OK;
    }
    else {
      local_90 = (Result_t *)Kumu::RESULT_FAIL;
    }
    Kumu::Result_t::operator=((Result_t *)this,local_90);
    UL::~UL(&local_60);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader& Reader, const UL& label)
{
  Result_t result = KLVFilePacket::InitFromFile(Reader);

  if ( ASDCP_SUCCESS(result) )
    result = ( UL(m_KeyStart) == label ) ? RESULT_OK : RESULT_FAIL;

  return result;
}